

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O2

void msd_A_lsd_adaptive6(uchar **strings,size_t N)

{
  Cacheblock<6U> *cache;
  uchar **ppuVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  
  cache = (Cacheblock<6U> *)malloc(N << 4);
  ppuVar1 = &cache->ptr;
  for (sVar3 = 0; N != sVar3; sVar3 = sVar3 + 1) {
    *ppuVar1 = strings[sVar3];
    ppuVar1 = ppuVar1 + 2;
  }
  fill_cache<6u>(cache,N,0);
  msd_lsd_adaptive<6u>(cache,N,0);
  lVar2 = 4;
  while (bVar4 = N != 0, N = N - 1, bVar4) {
    *(undefined8 *)((long)strings + lVar2 + -4) =
         *(undefined8 *)((cache->chars)._M_elems + lVar2 * 2);
    lVar2 = lVar2 + 8;
  }
  free(cache);
  return;
}

Assistant:

void msd_A_lsd_adaptive6(unsigned char** strings, size_t N)
{ msd_A_lsd_adaptive<6>(strings, N); }